

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall
wasm::BinaryInstWriter::visitArrayInitElem(BinaryInstWriter *this,ArrayInitElem *curr)

{
  WasmBinaryWriter *this_00;
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  HeapType type;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  LEB<unsigned_int,_unsigned_char> local_2c;
  LEB<unsigned_int,_unsigned_char> local_28;
  uchar local_22 [2];
  
  bVar2 = wasm::Type::isNull(&curr->ref->type);
  if (bVar2) {
    local_22[1] = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_22 + 1);
  }
  else {
    local_22[0] = 0xfb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,local_22);
    local_28.value = 0x13;
    LEB<unsigned_int,_unsigned_char>::write(&local_28,(int)this->o,__buf,in_RCX);
    this_00 = this->parent;
    type = wasm::Type::getHeapType(&curr->ref->type);
    WasmBinaryWriter::writeIndexedHeapType(this_00,type);
    pBVar1 = this->o;
    local_2c.value =
         WasmBinaryWriter::getElementSegmentIndex
                   (this->parent,(Name)(curr->segment).super_IString.str);
    LEB<unsigned_int,_unsigned_char>::write(&local_2c,(int)pBVar1,__buf_00,in_RCX);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitArrayInitElem(ArrayInitElem* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::GCPrefix);
  o << U32LEB(BinaryConsts::ArrayInitElem);
  parent.writeIndexedHeapType(curr->ref->type.getHeapType());
  o << U32LEB(parent.getElementSegmentIndex(curr->segment));
}